

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pipeline_layout
          (Impl *this,VkPipelineLayoutCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipelineLayoutCreateInfo **out_create_info)

{
  VkPipelineLayoutCreateInfo *pVVar1;
  VkPushConstantRange *pVVar2;
  VkDescriptorSetLayout_T **ppVVar3;
  bool bVar4;
  VkPipelineLayoutCreateInfo *info;
  VkPipelineLayoutCreateInfo **out_create_info_local;
  ScratchAllocator *alloc_local;
  VkPipelineLayoutCreateInfo *create_info_local;
  Impl *this_local;
  
  bVar4 = create_info->pNext == (void *)0x0;
  if (bVar4) {
    pVVar1 = copy<VkPipelineLayoutCreateInfo>(this,create_info,1,alloc);
    pVVar2 = copy<VkPushConstantRange>
                       (this,pVVar1->pPushConstantRanges,(ulong)pVVar1->pushConstantRangeCount,alloc
                       );
    pVVar1->pPushConstantRanges = pVVar2;
    ppVVar3 = copy<VkDescriptorSetLayout_T*>
                        (this,pVVar1->pSetLayouts,(ulong)pVVar1->setLayoutCount,alloc);
    pVVar1->pSetLayouts = ppVVar3;
    *out_create_info = pVVar1;
  }
  return bVar4;
}

Assistant:

bool StateRecorder::Impl::copy_pipeline_layout(const VkPipelineLayoutCreateInfo *create_info, ScratchAllocator &alloc,
                                               VkPipelineLayoutCreateInfo **out_create_info)
{
	if (create_info->pNext)
		return false;

	auto *info = copy(create_info, 1, alloc);
	info->pPushConstantRanges = copy(info->pPushConstantRanges, info->pushConstantRangeCount, alloc);
	info->pSetLayouts = copy(info->pSetLayouts, info->setLayoutCount, alloc);

	*out_create_info = info;
	return true;
}